

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadSceneLibrary(ColladaParser *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Node *this_00;
  mapped_type *ppNVar5;
  undefined4 extraout_var_01;
  Node *node;
  char *attrName;
  int indexName;
  char *attrID;
  int indexID;
  ColladaParser *this_local;
  
  uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar2 & 1) == 0) {
    do {
      do {
        while( true ) {
          uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((uVar2 & 1) == 0) {
            return;
          }
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar3 != 1) break;
          bVar1 = IsElement(this,"visual_scene");
          if (bVar1) {
            uVar2 = GetAttribute(this,"id");
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar2);
            uVar2 = TestAttribute(this,"name");
            node = (Node *)anon_var_dwarf_858df;
            if (-1 < (int)uVar2) {
              iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar2);
              node = (Node *)CONCAT44(extraout_var_00,iVar4);
            }
            this_00 = (Node *)operator_new(0x118);
            Collada::Node::Node(this_00);
            std::__cxx11::string::operator=
                      ((string *)&this_00->mID,(char *)CONCAT44(extraout_var,iVar3));
            std::__cxx11::string::operator=((string *)this_00,(char *)node);
            ppNVar5 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>_>
                      ::operator[](&this->mNodeLibrary,&this_00->mID);
            *ppNVar5 = this_00;
            ReadSceneNode(this,this_00);
          }
          else {
            SkipElement(this);
          }
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar3 != 2);
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar3 = strcmp((char *)CONCAT44(extraout_var_01,iVar3),"library_visual_scenes");
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

void ColladaParser::ReadSceneLibrary()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            // a visual scene - generate root node under its ID and let ReadNode() do the recursive work
            if (IsElement("visual_scene"))
            {
                // read ID. Is optional according to the spec, but how on earth should a scene_instance refer to it then?
                int indexID = GetAttribute("id");
                const char* attrID = mReader->getAttributeValue(indexID);

                // read name if given.
                int indexName = TestAttribute("name");
                const char* attrName = "unnamed";
                if (indexName > -1)
                    attrName = mReader->getAttributeValue(indexName);

                // create a node and store it in the library under its ID
                Node* node = new Node;
                node->mID = attrID;
                node->mName = attrName;
                mNodeLibrary[node->mID] = node;

                ReadSceneNode(node);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "library_visual_scenes") == 0)
                //ThrowException( "Expected end of \"library_visual_scenes\" element.");

                break;
        }
    }
}